

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O1

char * __thiscall phosg::basename(phosg *this,char *__filename)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar2 = *(long *)(__filename + 8);
  if (lVar2 == 0) {
LAB_001070d0:
    lVar3 = -1;
  }
  else {
    lVar4 = lVar2;
    do {
      lVar3 = lVar4 + -1;
      if (lVar4 == 0) goto LAB_001070d0;
      pcVar1 = (char *)(*(long *)__filename + -1 + lVar4);
      lVar4 = lVar3;
    } while (*pcVar1 != '/');
  }
  if (lVar3 == -1) {
    *(phosg **)this = this + 0x10;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)this,*(long *)__filename,lVar2 + *(long *)__filename);
  }
  else {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__filename,
               lVar3 + 1,0xffffffffffffffff);
  }
  return (char *)this;
}

Assistant:

std::string basename(const std::string& filename) {
  size_t slash_pos = filename.rfind('/');
  return (slash_pos == string::npos) ? filename : filename.substr(slash_pos + 1);
}